

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O0

void __thiscall EdExplFinder::bfs_shortest_path(EdExplFinder *this)

{
  vec<int> *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *psVar6;
  reference pvVar7;
  void *pvVar8;
  reference pvVar9;
  int *piVar10;
  size_type sVar11;
  EdExplFinder *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar12;
  reference rVar13;
  pair<int,_int> node_2;
  int s_i_minus_1_j_minus_1;
  int subst_cost;
  int d_i_minus_1_j_minus_1;
  int c2;
  int c1;
  pair<int,_int> node_1;
  int s_i_minus_1_j;
  int d_i_minus_1_j;
  int del_cost;
  int c_1;
  int k_1;
  int ci_start;
  pair<int,_int> node;
  int s_ij_minus_1;
  int d_ij_minus_1;
  int ins_cost;
  int c;
  int k;
  int cj_start;
  int s_ij;
  int j;
  int i;
  pair<int,_int> currentNode;
  int d;
  pair<int,_int> start_node;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  node_set;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *nodeQueue;
  vector<int,_std::allocator<int>_> *shortestPathMatrix;
  value_type *in_stack_fffffffffffffc48;
  IntView<0> *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  _Rb_tree_const_iterator<std::pair<int,_int>_> in_stack_fffffffffffffc60;
  value_type *in_stack_fffffffffffffc68;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_fffffffffffffc70;
  int local_2ac;
  int local_224;
  int local_1a0;
  int local_19c;
  pair<int,_int> local_198;
  int local_190;
  value_type local_18c;
  reference local_188;
  reference local_178;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  _Base_ptr local_158;
  undefined1 local_150;
  int local_144;
  pair<int,_int> local_140;
  int local_138;
  value_type local_134;
  reference local_130;
  int local_11c;
  int local_118;
  int local_114;
  reference local_110;
  int local_100;
  int local_fc;
  _Base_ptr local_f8;
  undefined1 local_f0;
  int local_e4;
  pair<int,_int> local_e0;
  int local_d8;
  value_type local_d4;
  reference local_d0;
  int local_bc;
  int local_b8;
  int local_b4;
  reference local_b0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  value_type local_88;
  int local_7c;
  _Base_ptr local_78;
  undefined1 local_70;
  pair<int,_int> local_68 [7];
  void *local_30;
  undefined1 local_25;
  int local_14;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *local_10;
  
  psVar6 = (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            *)operator_new(0x18);
  local_25 = 1;
  local_14 = in_RDI->lb + 1;
  std::allocator<int>::allocator((allocator<int> *)0x1db75d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
             (size_type)in_stack_fffffffffffffc68,
             (value_type_conflict *)in_stack_fffffffffffffc60._M_node,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
  local_25 = 0;
  std::allocator<int>::~allocator((allocator<int> *)0x1db799);
  local_10 = psVar6;
  iVar3 = matrixCoord(in_RDI,in_RDI->seqSize,in_RDI->seqSize);
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar3);
  *pvVar7 = 0;
  pvVar8 = operator_new(0x50);
  std::queue<std::pair<int,int>,std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>>::
  queue<std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>
            ((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffc50);
  local_30 = pvVar8;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)0x1db81d);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(local_68,&in_RDI->seqSize,&in_RDI->seqSize);
  std::
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  ::push((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  pVar12 = std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::insert(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  local_78 = (_Base_ptr)pVar12.first._M_node;
  local_70 = pVar12.second;
  local_7c = in_RDI->lb / in_RDI->min_id_cost;
  do {
    do {
      bVar2 = std::
              queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::empty((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)0x1db8b9);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if (local_10 !=
            (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *)0x0) {
          psVar6 = local_10;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60._M_node);
          operator_delete(psVar6);
        }
        if (local_30 != (void *)0x0) {
          pvVar8 = local_30;
          std::
          queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::~queue((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)0x1dc6ab);
          operator_delete(pvVar8);
        }
        std::
        set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)0x1dc6c1);
        return;
      }
      pvVar9 = std::
               queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::front((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)0x1db8e1);
      local_88 = *pvVar9;
      std::
      queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::pop((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             *)0x1db90b);
      std::
      set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::erase((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      psVar6 = local_10;
      local_8c = local_88.first;
      local_90 = local_88.second;
      iVar3 = matrixCoord(in_RDI,local_88.first,local_88.second);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar3);
      local_94 = *pvVar7;
    } while (in_RDI->lb <= local_94);
    if ((-1 < local_90 + -1) && (local_8c - local_7c <= local_90 + -1)) {
      local_98 = 0;
      for (local_9c = local_90 + -1; local_9c < in_RDI->seqSize; local_9c = local_9c + 1) {
        excludedCharCoord(in_RDI,local_9c,0);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                            (size_type)in_stack_fffffffffffffc68);
        local_b0 = rVar13;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
        if (bVar2) {
          local_98 = 1;
          break;
        }
      }
      for (local_b4 = local_98; local_b4 <= in_RDI->max_char; local_b4 = local_b4 + 1) {
        if (local_b4 == 0) {
          local_224 = 0;
        }
        else {
          piVar10 = vec<int>::operator[](in_RDI->insertion_cost,local_b4 - 1);
          local_224 = *piVar10;
        }
        local_b8 = local_224;
        pvVar1 = in_RDI->dpMatrix;
        uVar4 = matrixCoord(in_RDI,local_8c,local_90 + -1);
        piVar10 = vec<int>::operator[](pvVar1,uVar4);
        psVar6 = local_10;
        local_bc = *piVar10;
        if (local_bc + local_b8 + local_94 < in_RDI->lb) {
          excludedCharCoord(in_RDI,local_90 + -1,local_b4);
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                              (size_type)in_stack_fffffffffffffc68);
          local_d0 = rVar13;
          std::_Bit_reference::operator=(&local_d0,true);
        }
        else {
          iVar3 = matrixCoord(in_RDI,local_8c,local_90 + -1);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar3);
          local_d4 = *pvVar7;
          local_d8 = local_94 + local_b8;
          piVar10 = std::min<int>(&local_d4,&local_d8);
          psVar6 = local_10;
          iVar3 = *piVar10;
          iVar5 = matrixCoord(in_RDI,local_8c,local_90 + -1);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar5);
          *pvVar7 = iVar3;
          local_e4 = local_90 + -1;
          std::pair<int,_int>::pair<int,_true>(&local_e0,&local_8c,&local_e4);
          sVar11 = std::
                   set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   ::count((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                            *)in_stack_fffffffffffffc60._M_node,
                           (key_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58)
                          );
          if (sVar11 == 0) {
            std::
            queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::push((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            pVar12 = std::
                     set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     ::insert(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            local_f8 = (_Base_ptr)pVar12.first._M_node;
            local_f0 = pVar12.second;
          }
        }
      }
    }
    if ((-1 < local_8c + -1) && (local_90 < local_8c + local_7c)) {
      local_fc = 0;
      for (local_100 = local_8c + -1; local_100 < in_RDI->seqSize; local_100 = local_100 + 1) {
        excludedCharCoord(in_RDI,local_100,0);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                            (size_type)in_stack_fffffffffffffc68);
        local_110 = rVar13;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_110);
        if (bVar2) {
          local_fc = 1;
          break;
        }
      }
      for (local_114 = local_fc; local_114 <= in_RDI->max_char; local_114 = local_114 + 1) {
        if (local_114 == 0) {
          local_2ac = 0;
        }
        else {
          piVar10 = vec<int>::operator[](in_RDI->deletion_cost,local_114 - 1);
          local_2ac = *piVar10;
        }
        local_118 = local_2ac;
        pvVar1 = in_RDI->dpMatrix;
        uVar4 = matrixCoord(in_RDI,local_8c + -1,local_90);
        piVar10 = vec<int>::operator[](pvVar1,uVar4);
        psVar6 = local_10;
        local_11c = *piVar10;
        if (local_11c + local_118 + local_94 < in_RDI->lb) {
          excludedCharCoord(in_RDI,local_8c + -1,local_114);
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                              (size_type)in_stack_fffffffffffffc68);
          local_130 = rVar13;
          std::_Bit_reference::operator=(&local_130,true);
        }
        else {
          iVar3 = matrixCoord(in_RDI,local_8c + -1,local_90);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar3);
          local_134 = *pvVar7;
          local_138 = local_94 + local_118;
          piVar10 = std::min<int>(&local_134,&local_138);
          psVar6 = local_10;
          iVar3 = *piVar10;
          iVar5 = matrixCoord(in_RDI,local_8c + -1,local_90);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar5);
          *pvVar7 = iVar3;
          local_144 = local_8c + -1;
          std::pair<int,_int>::pair<int,_true>(&local_140,&local_144,&local_90);
          sVar11 = std::
                   set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   ::count((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                            *)in_stack_fffffffffffffc60._M_node,
                           (key_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58)
                          );
          if (sVar11 == 0) {
            std::
            queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::push((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            pVar12 = std::
                     set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     ::insert(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            local_158 = (_Base_ptr)pVar12.first._M_node;
            local_150 = pVar12.second;
          }
        }
      }
    }
    if ((-1 < local_8c + -1) && (-1 < local_90 + -1)) {
      for (local_15c = 1; local_15c <= in_RDI->max_char; local_15c = local_15c + 1) {
        for (local_160 = 1; local_160 <= in_RDI->max_char; local_160 = local_160 + 1) {
          pvVar1 = in_RDI->dpMatrix;
          uVar4 = matrixCoord(in_RDI,local_8c + -1,local_90 + -1);
          piVar10 = vec<int>::operator[](pvVar1,uVar4);
          local_164 = *piVar10;
          pvVar1 = in_RDI->substitution_cost;
          uVar4 = substCoord(in_RDI,local_15c,local_160);
          piVar10 = vec<int>::operator[](pvVar1,uVar4);
          psVar6 = local_10;
          local_168 = *piVar10;
          if (local_164 + local_168 + local_94 < in_RDI->lb) {
            bVar2 = IntView<0>::indomain
                              (in_stack_fffffffffffffc50,(int64_t)in_stack_fffffffffffffc48);
            if (bVar2) {
              excludedCharCoord(in_RDI,local_90 + -1,local_160);
              rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                                  (size_type)in_stack_fffffffffffffc68);
              local_178 = rVar13;
              std::_Bit_reference::operator=(&local_178,true);
            }
            else {
              excludedCharCoord(in_RDI,local_8c + -1,local_15c);
              rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
                                  (size_type)in_stack_fffffffffffffc68);
              local_188 = rVar13;
              std::_Bit_reference::operator=(&local_188,true);
            }
          }
          else {
            iVar3 = matrixCoord(in_RDI,local_8c + -1,local_90 + -1);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)psVar6,(long)iVar3);
            local_18c = *pvVar7;
            local_190 = local_94 + local_168;
            piVar10 = std::min<int>(&local_18c,&local_190);
            iVar3 = *piVar10;
            in_stack_fffffffffffffc70 = local_10;
            iVar5 = matrixCoord(in_RDI,local_8c + -1,local_90 + -1);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                                (long)iVar5);
            *pvVar7 = iVar3;
            local_19c = local_8c + -1;
            local_1a0 = local_90 + -1;
            std::pair<int,_int>::pair<int,_int,_true>(&local_198,&local_19c,&local_1a0);
            in_stack_fffffffffffffc68 =
                 (value_type *)
                 std::
                 set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::count((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                          *)in_stack_fffffffffffffc60._M_node,
                         (key_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
            if (in_stack_fffffffffffffc68 == (value_type *)0x0) {
              std::
              queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::push((queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              pVar12 = std::
                       set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                       ::insert(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
              in_stack_fffffffffffffc60 = pVar12.first._M_node;
              in_stack_fffffffffffffc5f = pVar12.second;
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void EdExplFinder::bfs_shortest_path() {
	auto* shortestPathMatrix =
			new std::vector<int>(static_cast<size_t>((seqSize + 1) * (seqSize + 1)), lb + 1);
	// set shortest path for bottom right position to 0 cost
	(*shortestPathMatrix)[matrixCoord(seqSize, seqSize)] = 0;

	auto* nodeQueue = new std::queue<std::pair<int, int> >();
	std::set<std::pair<int, int> > node_set;
	// start with bottom right position
	const std::pair<int, int> start_node = std::pair<int, int>(seqSize, seqSize);
	nodeQueue->push(start_node);
	node_set.insert(start_node);

	// d = distance to diagonal that should be calculated in the matrix
	const int d = lb / min_id_cost;

	while (!nodeQueue->empty()) {
		const std::pair<int, int> currentNode = nodeQueue->front();
		nodeQueue->pop();
		node_set.erase(currentNode);

		const int i = currentNode.first;
		const int j = currentNode.second;

		const int s_ij = (*shortestPathMatrix)[matrixCoord(i, j)];

		if (s_ij >= lb) {
			continue;
		}

		//
		// process move to the left
		//
		if (j - 1 >= 0 && j - 1 >= i - d) {
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			int cj_start = 0;
			for (int k = j - 1; k < seqSize; k++) {
				if ((*seq2ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					cj_start = 1;
					break;
				}
			}
			for (int c = cj_start; c <= max_char; c++) {
				const int ins_cost = c == 0 ? 0 : (*insertion_cost)[c - 1];
				const int d_ij_minus_1 = (*dpMatrix)[matrixCoord(i, j - 1)];
				if (d_ij_minus_1 + ins_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_ij_minus_1 = (*shortestPathMatrix)[matrixCoord(i, j - 1)];
					(*shortestPathMatrix)[matrixCoord(i, j - 1)] = std::min(s_ij_minus_1, s_ij + ins_cost);

					const std::pair<int, int> node = std::pair<int, int>(i, j - 1);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process upwards move
		//
		if (i - 1 >= 0 && j < i + d) {
			int ci_start = 0;
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			for (int k = i - 1; k < seqSize; k++) {
				if ((*seq1ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					ci_start = 1;
					break;
				}
			}
			for (int c = ci_start; c <= max_char; c++) {
				const int del_cost = c == 0 ? 0 : (*deletion_cost)[c - 1];
				const int d_i_minus_1_j = (*dpMatrix)[matrixCoord(i - 1, j)];
				if (d_i_minus_1_j + del_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_i_minus_1_j = (*shortestPathMatrix)[matrixCoord(i - 1, j)];
					(*shortestPathMatrix)[matrixCoord(i - 1, j)] = std::min(s_i_minus_1_j, s_ij + del_cost);

					const std::pair<int, int> node = std::pair<int, int>(i - 1, j);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process diagonal move
		//
		if (i - 1 >= 0 && j - 1 >= 0) {
			for (int c1 = 1; c1 <= max_char; c1++) {
				for (int c2 = 1; c2 <= max_char; c2++) {
					const int d_i_minus_1_j_minus_1 = (*dpMatrix)[matrixCoord(i - 1, j - 1)];
					const int subst_cost = (*substitution_cost)[substCoord(c1, c2)];

					if (d_i_minus_1_j_minus_1 + subst_cost + s_ij < lb) {
						// we can either exclude the character for seq1 or seq2
						if (seq1[i - 1].indomain(c1)) {
							// if seq1 contains c1, we exclude c2 from seq2
							(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c2)] = true;
						} else {
							// if seq2 contains c2, or neither seq1/seq2 contain c1/c2 we exclude c1 from seq1
							(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c1)] = true;
						}
					} else {
						const int s_i_minus_1_j_minus_1 = (*shortestPathMatrix)[matrixCoord(i - 1, j - 1)];
						(*shortestPathMatrix)[matrixCoord(i - 1, j - 1)] =
								std::min(s_i_minus_1_j_minus_1, s_ij + subst_cost);

						const std::pair<int, int> node = std::pair<int, int>(i - 1, j - 1);
						if (node_set.count(node) == 0) {
							nodeQueue->push(node);
							node_set.insert(node);
						}
					}
				}
			}
		}
	}

#ifndef NDEBUG
	debug_print(shortestPathMatrix);
#endif

	delete shortestPathMatrix;
	delete nodeQueue;
}